

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

int cdef_sb_row_worker_hook(void *arg1,void *arg2)

{
  AV1_COMMON *cm_00;
  pthread_mutex_t *__mutex;
  int iVar1;
  int iVar2;
  undefined8 *in_RSI;
  AV1CdefSync *in_RDI;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  YV12_BUFFER_CONFIG *in_stack_00000018;
  int v_end;
  int v_start;
  int unit_height;
  int mi_high;
  int is_uv;
  YV12_BUFFER_CONFIG *ybf;
  int plane;
  MACROBLOCKD *xd;
  int num_planes;
  int cur_fbr;
  aom_internal_error_info *error_info;
  pthread_mutex_t *job_mutex_;
  int nvfb;
  AV1_COMMON *cm;
  AV1CdefWorkerData *cdef_worker;
  AV1CdefSync *cdef_sync;
  int in_stack_00000a0c;
  uint16_t *in_stack_00000a10;
  uint16_t **in_stack_00000a18;
  uint16_t **in_stack_00000a20;
  MACROBLOCKD *in_stack_00000a28;
  AV1_COMMON *in_stack_00000a30;
  cdef_init_fb_row_t in_stack_00000a40;
  AV1CdefSyncData *in_stack_00000a48;
  aom_internal_error_info *in_stack_00000a50;
  int *in_stack_ffffffffffffff68;
  AV1CdefSync *in_stack_ffffffffffffff70;
  int local_5c;
  int local_4;
  
  cm_00 = (AV1_COMMON *)*in_RSI;
  __mutex = in_RDI->mutex_;
  iVar1 = _setjmp((__jmp_buf_tag *)(in_RSI + 0x26));
  if (iVar1 == 0) {
    *(undefined4 *)(in_RSI + 0x25) = 1;
    iVar1 = av1_num_planes(cm_00);
    while (iVar2 = get_cdef_row_next_job(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0),
          iVar2 != 0) {
      in_stack_ffffffffffffff68 = (int *)in_RSI[9];
      in_stack_ffffffffffffff70 = in_RDI;
      av1_cdef_fb_row(in_stack_00000a30,in_stack_00000a28,in_stack_00000a20,in_stack_00000a18,
                      in_stack_00000a10,in_stack_00000a0c,in_stack_00000a40,in_stack_00000a48,
                      in_stack_00000a50);
      if (*(int *)(in_RSI + 10) != 0) {
        for (local_5c = 0; local_5c < iVar1; local_5c = local_5c + 1) {
          aom_extend_frame_borders_plane_row_c
                    (in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c);
        }
      }
    }
    *(undefined4 *)(in_RSI + 0x25) = 0;
    local_4 = 1;
  }
  else {
    *(undefined4 *)(in_RSI + 0x25) = 0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    iVar1 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    in_RDI->cdef_mt_exit = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    set_cdef_init_fb_row_done(in_stack_ffffffffffffff70,iVar1);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int cdef_sb_row_worker_hook(void *arg1, void *arg2) {
  AV1CdefSync *const cdef_sync = (AV1CdefSync *)arg1;
  AV1CdefWorkerData *const cdef_worker = (AV1CdefWorkerData *)arg2;
  AV1_COMMON *cm = cdef_worker->cm;
  const int nvfb = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *job_mutex_ = cdef_sync->mutex_;
#endif
  struct aom_internal_error_info *const error_info = &cdef_worker->error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(job_mutex_);
    cdef_sync->cdef_mt_exit = true;
    pthread_mutex_unlock(job_mutex_);
#endif
    // In case of cdef row-multithreading, the worker on a filter block row
    // (fbr) waits for the line buffers (top and bottom) copy of the above row.
    // Hence, in case a thread (main/worker) encounters an error before copying
    // of the line buffers, update that line buffer copy is complete in order to
    // avoid dependent workers waiting indefinitely.
    set_cdef_init_fb_row_done(cdef_sync, nvfb);
    return 0;
  }
  error_info->setjmp = 1;

  volatile int cur_fbr;
  const int num_planes = av1_num_planes(cm);
  while (get_cdef_row_next_job(cdef_sync, &cur_fbr, nvfb)) {
    MACROBLOCKD *xd = cdef_worker->xd;
    av1_cdef_fb_row(cm, xd, cdef_worker->linebuf, cdef_worker->colbuf,
                    cdef_worker->srcbuf, cur_fbr,
                    cdef_worker->cdef_init_fb_row_fn, cdef_sync, error_info);
    if (cdef_worker->do_extend_border) {
      for (int plane = 0; plane < num_planes; ++plane) {
        const YV12_BUFFER_CONFIG *ybf = &cm->cur_frame->buf;
        const int is_uv = plane > 0;
        const int mi_high = MI_SIZE_LOG2 - xd->plane[plane].subsampling_y;
        const int unit_height = MI_SIZE_64X64 << mi_high;
        const int v_start = cur_fbr * unit_height;
        const int v_end =
            AOMMIN(v_start + unit_height, ybf->crop_heights[is_uv]);
        aom_extend_frame_borders_plane_row(ybf, plane, v_start, v_end);
      }
    }
  }
  error_info->setjmp = 0;
  return 1;
}